

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.h
# Opt level: O2

void __thiscall cmComputeLinkDepends::LinkEntry::LinkEntry(LinkEntry *this,LinkEntry *param_1)

{
  cmSourceFile *pcVar1;
  
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            (&this->Item,&param_1->Item);
  this->Kind = param_1->Kind;
  pcVar1 = param_1->ObjectSource;
  this->Target = param_1->Target;
  this->ObjectSource = pcVar1;
  std::__cxx11::string::string((string *)&this->Feature,(string *)&param_1->Feature);
  return;
}

Assistant:

LinkEntry() = default;